

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolormap.cpp
# Opt level: O0

QColormap * __thiscall QColormap::operator=(QColormap *this,QColormap *colormap)

{
  QColormapPrivate **in_RSI;
  QColormapPrivate *in_RDI;
  
  qAtomicAssign<QColormapPrivate>(in_RSI,in_RDI);
  return (QColormap *)in_RDI;
}

Assistant:

QColormap &QColormap::operator=(const QColormap &colormap)
{ qAtomicAssign(d, colormap.d); return *this; }